

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O3

void __thiscall
duckdb::LocalFileSecretStorage::LocalFileSecretStorage
          (LocalFileSecretStorage *this,SecretManager *manager,DatabaseInstance *db_p,string *name_p
          ,string *secret_path_p)

{
  string *__return_storage_ptr__;
  pointer pcVar1;
  bool bVar2;
  Catalog *catalog;
  Catalog *catalog_p;
  DefaultSecretGenerator *this_00;
  CatalogSet *this_01;
  LocalFileSystem fs;
  FileSystem local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  (this->super_CatalogSetSecretStorage).super_SecretStorage._vptr_SecretStorage =
       (_func_int **)&PTR__SecretStorage_01971108;
  (this->super_CatalogSetSecretStorage).super_SecretStorage.storage_name._M_dataplus._M_p =
       (pointer)&(this->super_CatalogSetSecretStorage).super_SecretStorage.storage_name.field_2;
  pcVar1 = (name_p->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_CatalogSetSecretStorage).super_SecretStorage.storage_name,
             pcVar1,pcVar1 + name_p->_M_string_length);
  (this->super_CatalogSetSecretStorage).super_SecretStorage.tie_break_offset = 0x14;
  (this->super_CatalogSetSecretStorage).super_SecretStorage.persistent = false;
  (this->super_CatalogSetSecretStorage).secrets.
  super_unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>._M_t.
  super___uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CatalogSet_*,_std::default_delete<duckdb::CatalogSet>_>.
  super__Head_base<0UL,_duckdb::CatalogSet_*,_false>._M_head_impl = (CatalogSet *)0x0;
  (this->super_CatalogSetSecretStorage).db = db_p;
  (this->super_CatalogSetSecretStorage).super_SecretStorage._vptr_SecretStorage =
       (_func_int **)&PTR__LocalFileSecretStorage_01970df0;
  (this->persistent_secrets)._M_h._M_buckets = &(this->persistent_secrets)._M_h._M_single_bucket;
  (this->persistent_secrets)._M_h._M_bucket_count = 1;
  (this->persistent_secrets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->persistent_secrets)._M_h._M_element_count = 0;
  (this->persistent_secrets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->persistent_secrets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->persistent_secrets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __return_storage_ptr__ = &this->secret_path;
  FileSystem::ExpandPath
            (__return_storage_ptr__,secret_path_p,(optional_ptr<duckdb::FileOpener,_true>)0x0);
  (this->super_CatalogSetSecretStorage).super_SecretStorage.persistent = true;
  local_58._vptr_FileSystem = (_func_int **)&PTR__FileSystem_0196e5c8;
  bVar2 = LocalFileSystem::DirectoryExists
                    ((LocalFileSystem *)&local_58,__return_storage_ptr__,
                     (optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (bVar2) {
    local_38 = ::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:142:29)>
               ::_M_invoke;
    local_40 = ::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:142:29)>
               ::_M_manager;
    local_50._M_unused._M_object = &local_58;
    local_50._8_8_ = this;
    LocalFileSystem::ListFiles
              ((LocalFileSystem *)&local_58,__return_storage_ptr__,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&local_50,(FileOpener *)0x0);
    if (local_40 != (code *)0x0) {
      (*local_40)((_Any_data *)&local_50,(_Any_data *)&local_50,__destroy_functor);
    }
  }
  catalog = Catalog::GetSystemCatalog((this->super_CatalogSetSecretStorage).db);
  catalog_p = Catalog::GetSystemCatalog((this->super_CatalogSetSecretStorage).db);
  this_00 = (DefaultSecretGenerator *)operator_new(0x58);
  DefaultSecretGenerator::DefaultSecretGenerator(this_00,catalog,manager,&this->persistent_secrets);
  this_01 = (CatalogSet *)operator_new(0x68);
  local_50._M_unused._M_object = this_00;
  CatalogSet::CatalogSet
            (this_01,catalog_p,
             (unique_ptr<duckdb::DefaultGenerator,_std::default_delete<duckdb::DefaultGenerator>,_true>
              *)&local_50);
  if ((DefaultSecretGenerator *)local_50._M_unused._0_8_ != (DefaultSecretGenerator *)0x0) {
    (**(code **)(*local_50._M_unused._M_object + 8))();
  }
  ::std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &(this->super_CatalogSetSecretStorage).secrets,this_01);
  FileSystem::~FileSystem(&local_58);
  return;
}

Assistant:

LocalFileSecretStorage::LocalFileSecretStorage(SecretManager &manager, DatabaseInstance &db_p, const string &name_p,
                                               const string &secret_path_p)
    : CatalogSetSecretStorage(db_p, name_p, LOCAL_FILE_STORAGE_OFFSET),
      secret_path(FileSystem::ExpandPath(secret_path_p, nullptr)) {
	persistent = true;

	// Check existence of persistent secret dir
	LocalFileSystem fs;
	if (fs.DirectoryExists(secret_path)) {
		fs.ListFiles(secret_path, [&](const string &fname, bool is_dir) {
			string full_path = fs.JoinPath(secret_path, fname);

			if (StringUtil::EndsWith(full_path, ".duckdb_secret")) {
				string secret_name = fname.substr(0, fname.size() - 14); // size of file ext
				persistent_secrets.insert(secret_name);
			}
		});
	}

	auto &catalog = Catalog::GetSystemCatalog(db);
	secrets = make_uniq<CatalogSet>(Catalog::GetSystemCatalog(db),
	                                make_uniq<DefaultSecretGenerator>(catalog, manager, persistent_secrets));
}